

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_eval_simd.h
# Opt level: O2

vboolf_impl<4> __thiscall
embree::sse2::
PatchEvalSimd<embree::vboolf_impl<4>,_embree::vint_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>
::eval_quad(PatchEvalSimd<embree::vboolf_impl<4>,_embree::vint_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>
            *this,vboolf_impl<4> *valid,SubdividedQuadPatch *This,vfloat_impl<4> *u,
           vfloat_impl<4> *v,float dscale,size_t depth)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  undefined4 uVar10;
  undefined8 uVar11;
  float *pfVar12;
  float *pfVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  vboolf_impl<4> vVar18;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar19;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar20;
  vboolf_impl<4> u1v1_mask;
  vboolf_impl<4> u1v0_mask;
  vboolf_impl<4> u0v1_mask;
  vboolf_impl<4> u0v0_mask;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_c8;
  PatchEvalSimd<embree::vboolf_impl<4>,_embree::vint_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>
  local_b8;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  uint local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  
  pfVar13 = (float *)mm_lookupmask_ps._8_8_;
  pfVar12 = (float *)mm_lookupmask_ps._0_8_;
  this->P = (float *)mm_lookupmask_ps._0_8_;
  this->dPdu = pfVar13;
  fVar3 = (v->field_0).v[0];
  fVar4 = (v->field_0).v[1];
  fVar5 = (v->field_0).v[2];
  fVar6 = (v->field_0).v[3];
  local_d8 = *(float *)depth;
  fStack_d4 = *(float *)(depth + 4);
  fStack_d0 = *(float *)(depth + 8);
  fStack_cc = *(float *)(depth + 0xc);
  local_b8.ddPdvdv._0_4_ = (uint)This->child[0].ptr;
  local_b8.ddPdvdv._4_4_ = *(uint *)((long)&This->child[0].ptr + 4);
  local_b8.ddPdudv._0_4_ = (uint)This->child[1].ptr;
  local_b8.ddPdudv._4_4_ = *(uint *)((long)&This->child[1].ptr + 4);
  local_b8.dstride._0_4_ = -(uint)(fVar3 < 0.5) & (uint)local_b8.ddPdvdv;
  local_b8.dstride._4_4_ = -(uint)(fVar4 < 0.5) & local_b8.ddPdvdv._4_4_;
  local_b8.N._0_4_ = -(uint)(fVar5 < 0.5) & (uint)local_b8.ddPdudv;
  local_b8.N._4_4_ = -(uint)(fVar6 < 0.5) & local_b8.ddPdudv._4_4_;
  local_48 = -(uint)(local_d8 < 0.5) & (uint)local_b8.dstride;
  uStack_44 = -(uint)(fStack_d4 < 0.5) & local_b8.dstride._4_4_;
  uStack_40 = -(uint)(fStack_d0 < 0.5) & (uint)local_b8.N;
  uStack_3c = -(uint)(fStack_cc < 0.5) & local_b8.N._4_4_;
  local_b8.dstride._0_4_ = (uint)local_b8.dstride & -(uint)(0.5 <= local_d8);
  local_b8.dstride._4_4_ = local_b8.dstride._4_4_ & -(uint)(0.5 <= fStack_d4);
  local_b8.N._0_4_ = (uint)local_b8.N & -(uint)(0.5 <= fStack_d0);
  local_b8.N._4_4_ = local_b8.N._4_4_ & -(uint)(0.5 <= fStack_cc);
  local_b8.ddPdvdv._0_4_ = -(uint)(0.5 <= fVar3) & (uint)local_b8.ddPdvdv;
  local_b8.ddPdvdv._4_4_ = -(uint)(0.5 <= fVar4) & local_b8.ddPdvdv._4_4_;
  local_b8.ddPdudv._0_4_ = -(uint)(0.5 <= fVar5) & (uint)local_b8.ddPdudv;
  local_b8.ddPdudv._4_4_ = -(uint)(0.5 <= fVar6) & local_b8.ddPdudv._4_4_;
  uVar14 = -(uint)(local_d8 < 0.5) & (uint)local_b8.ddPdvdv;
  uVar15 = -(uint)(fStack_d4 < 0.5) & local_b8.ddPdvdv._4_4_;
  uVar16 = -(uint)(fStack_d0 < 0.5) & (uint)local_b8.ddPdudv;
  uVar17 = -(uint)(fStack_cc < 0.5) & local_b8.ddPdudv._4_4_;
  local_b8.ddPdvdv._0_4_ = (uint)local_b8.ddPdvdv & -(uint)(0.5 <= local_d8);
  local_b8.ddPdvdv._4_4_ = local_b8.ddPdvdv._4_4_ & -(uint)(0.5 <= fStack_d4);
  local_b8.ddPdudv._0_4_ = (uint)local_b8.ddPdudv & -(uint)(0.5 <= fStack_d0);
  local_b8.ddPdudv._4_4_ = local_b8.ddPdudv._4_4_ & -(uint)(0.5 <= fStack_cc);
  auVar1._4_4_ = uStack_44;
  auVar1._0_4_ = local_48;
  auVar1._8_4_ = uStack_40;
  auVar1._12_4_ = uStack_3c;
  iVar9 = movmskps(0x2223f80,auVar1);
  local_78 = (uint)local_b8.ddPdvdv;
  uStack_74 = local_b8.ddPdvdv._4_4_;
  uStack_70 = (uint)local_b8.ddPdudv;
  uStack_6c = local_b8.ddPdudv._4_4_;
  local_68 = uVar14;
  uStack_64 = uVar15;
  uStack_60 = uVar16;
  uStack_5c = uVar17;
  local_58 = (uint)local_b8.dstride;
  uStack_54 = local_b8.dstride._4_4_;
  uStack_50 = (uint)local_b8.N;
  uStack_4c = local_b8.N._4_4_;
  if (iVar9 == 0) {
    uVar10 = 0;
  }
  else {
    local_c8.v[0] = fVar3 + fVar3;
    local_c8.v[1] = fVar4 + fVar4;
    local_c8.v[2] = fVar5 + fVar5;
    local_c8.v[3] = fVar6 + fVar6;
    local_d8 = local_d8 + local_d8;
    fStack_d4 = fStack_d4 + fStack_d4;
    fStack_d0 = fStack_d0 + fStack_d0;
    fStack_cc = fStack_cc + fStack_cc;
    local_b8.dPdv._0_4_ = uVar14;
    local_b8.dPdv._4_4_ = uVar15;
    local_b8.ddPdudu._0_4_ = uVar16;
    local_b8.ddPdudu._4_4_ = uVar17;
    vVar18 = eval(&local_b8,valid,(Ref)&local_48,*(vfloat_impl<4> **)&u->field_0,
                  (vfloat_impl<4> *)&local_c8,dscale + dscale,(size_t)&local_d8);
    This = vVar18.field_0._8_8_;
    uVar10 = vVar18.field_0._0_4_;
    pfVar12 = (float *)((ulong)pfVar12 | (ulong)local_b8.P);
    pfVar13 = (float *)((ulong)pfVar13 | (ulong)local_b8.dPdu);
    this->P = pfVar12;
    this->dPdu = pfVar13;
    uVar14 = (uint)local_b8.dPdv;
    uVar15 = local_b8.dPdv._4_4_;
    uVar16 = (uint)local_b8.ddPdudu;
    uVar17 = local_b8.ddPdudu._4_4_;
  }
  auVar2._4_4_ = uVar15;
  auVar2._0_4_ = uVar14;
  auVar2._8_4_ = uVar16;
  auVar2._12_4_ = uVar17;
  uVar14 = movmskps(uVar10,auVar2);
  aVar19.v[1] = 0.0;
  aVar19.i[0] = uVar14;
  aVar19._8_8_ = This;
  if (uVar14 != 0) {
    local_c8.v[0] = (v->field_0).v[0] + (v->field_0).v[0] + -1.0;
    local_c8.v[1] = (v->field_0).v[1] + (v->field_0).v[1] + -1.0;
    local_c8.v[2] = (v->field_0).v[2] + (v->field_0).v[2] + -1.0;
    local_c8.v[3] = (v->field_0).v[3] + (v->field_0).v[3] + -1.0;
    local_d8 = *(float *)depth + *(float *)depth;
    fStack_d4 = *(float *)(depth + 4) + *(float *)(depth + 4);
    fStack_d0 = *(float *)(depth + 8) + *(float *)(depth + 8);
    fStack_cc = *(float *)(depth + 0xc) + *(float *)(depth + 0xc);
    aVar19 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
             eval(&local_b8,valid,(Ref)&local_68,*(vfloat_impl<4> **)((long)&u->field_0 + 8),
                  (vfloat_impl<4> *)&local_c8,dscale + dscale,(size_t)&local_d8);
    pfVar12 = (float *)((ulong)pfVar12 | (ulong)local_b8.P);
    pfVar13 = (float *)((ulong)pfVar13 | (ulong)local_b8.dPdu);
    this->P = pfVar12;
    this->dPdu = pfVar13;
  }
  auVar7._4_4_ = local_b8.ddPdvdv._4_4_;
  auVar7._0_4_ = (uint)local_b8.ddPdvdv;
  auVar7._8_4_ = (uint)local_b8.ddPdudv;
  auVar7._12_4_ = local_b8.ddPdudv._4_4_;
  uVar14 = movmskps(aVar19.v[0],auVar7);
  aVar20.v[1] = 0.0;
  aVar20.i[0] = uVar14;
  aVar20._8_8_ = aVar19._8_8_;
  if (uVar14 != 0) {
    local_c8.v[0] = (v->field_0).v[0] + (v->field_0).v[0] + -1.0;
    local_c8.v[1] = (v->field_0).v[1] + (v->field_0).v[1] + -1.0;
    local_c8.v[2] = (v->field_0).v[2] + (v->field_0).v[2] + -1.0;
    local_c8.v[3] = (v->field_0).v[3] + (v->field_0).v[3] + -1.0;
    local_d8 = *(float *)depth + *(float *)depth + -1.0;
    fStack_d4 = *(float *)(depth + 4) + *(float *)(depth + 4) + -1.0;
    fStack_d0 = *(float *)(depth + 8) + *(float *)(depth + 8) + -1.0;
    fStack_cc = *(float *)(depth + 0xc) + *(float *)(depth + 0xc) + -1.0;
    aVar20 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
             eval(&local_b8,valid,(Ref)&local_78,*(vfloat_impl<4> **)&u[1].field_0,
                  (vfloat_impl<4> *)&local_c8,dscale + dscale,(size_t)&local_d8);
    pfVar12 = (float *)((ulong)pfVar12 | (ulong)local_b8.P);
    pfVar13 = (float *)((ulong)pfVar13 | (ulong)local_b8.dPdu);
    this->P = pfVar12;
    this->dPdu = pfVar13;
  }
  uVar11 = aVar20._8_8_;
  auVar8._4_4_ = local_b8.dstride._4_4_;
  auVar8._0_4_ = (uint)local_b8.dstride;
  auVar8._8_4_ = (uint)local_b8.N;
  auVar8._12_4_ = local_b8.N._4_4_;
  iVar9 = movmskps(aVar20.v[0],auVar8);
  if (iVar9 != 0) {
    local_c8.v[0] = (v->field_0).v[0] + (v->field_0).v[0];
    local_c8.v[1] = (v->field_0).v[1] + (v->field_0).v[1];
    local_c8.v[2] = (v->field_0).v[2] + (v->field_0).v[2];
    local_c8.v[3] = (v->field_0).v[3] + (v->field_0).v[3];
    local_d8 = *(float *)depth + *(float *)depth + -1.0;
    fStack_d4 = *(float *)(depth + 4) + *(float *)(depth + 4) + -1.0;
    fStack_d0 = *(float *)(depth + 8) + *(float *)(depth + 8) + -1.0;
    fStack_cc = *(float *)(depth + 0xc) + *(float *)(depth + 0xc) + -1.0;
    vVar18 = eval(&local_b8,valid,(Ref)&local_58,*(vfloat_impl<4> **)((long)&u[1].field_0 + 8),
                  (vfloat_impl<4> *)&local_c8,dscale + dscale,(size_t)&local_d8);
    uVar11 = vVar18.field_0._8_8_;
    this->P = (float *)((ulong)pfVar12 | (ulong)local_b8.P);
    this->dPdu = (float *)((ulong)pfVar13 | (ulong)local_b8.dPdu);
  }
  vVar18.field_0._8_8_ = uVar11;
  vVar18.field_0._0_8_ = this;
  return (vboolf_impl<4>)vVar18.field_0;
}

Assistant:

vbool eval_quad(const vbool& valid, const typename Patch::SubdividedQuadPatch* This, const vfloat& u, const vfloat& v, const float dscale, const size_t depth)
        {
          vbool ret = false;
          const vbool u0_mask = u < 0.5f, u1_mask = u >= 0.5f;
          const vbool v0_mask = v < 0.5f, v1_mask = v >= 0.5f;
          const vbool u0v0_mask = valid & u0_mask & v0_mask;
          const vbool u0v1_mask = valid & u0_mask & v1_mask;
          const vbool u1v0_mask = valid & u1_mask & v0_mask;
          const vbool u1v1_mask = valid & u1_mask & v1_mask;
          if (any(u0v0_mask)) ret |= eval(u0v0_mask,This->child[0],2.0f*u,2.0f*v,2.0f*dscale,depth+1);
          if (any(u1v0_mask)) ret |= eval(u1v0_mask,This->child[1],2.0f*u-1.0f,2.0f*v,2.0f*dscale,depth+1);
          if (any(u1v1_mask)) ret |= eval(u1v1_mask,This->child[2],2.0f*u-1.0f,2.0f*v-1.0f,2.0f*dscale,depth+1);
          if (any(u0v1_mask)) ret |= eval(u0v1_mask,This->child[3],2.0f*u,2.0f*v-1.0f,2.0f*dscale,depth+1);
          return ret;
        }